

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

int Potassco::xconvert(char *x,string *out,char **errPos,int sep)

{
  char *pcVar1;
  long lVar2;
  int in_ECX;
  long *in_RDX;
  string *in_RSI;
  char *in_RDI;
  char *end;
  
  if (in_ECX != 0) {
    pcVar1 = strchr(in_RDI,(int)(char)in_ECX);
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::assign((char *)in_RSI,(ulong)in_RDI);
      goto LAB_0026b8f7;
    }
  }
  std::__cxx11::string::operator=(in_RSI,in_RDI);
LAB_0026b8f7:
  if (in_RDX != (long *)0x0) {
    lVar2 = std::__cxx11::string::length();
    *in_RDX = (long)(in_RDI + lVar2);
  }
  return 1;
}

Assistant:

int xconvert(const char* x, string& out, const char** errPos, int sep) {
	const char* end;
	if (sep == 0 || (end = strchr(x, char(sep))) == 0) {
		out = x;
	}
	else {
		out.assign(x, end - x);
	}
	if (errPos) { *errPos = x + out.length(); }
	return 1;
}